

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O3

void de::cmdline::detail::
     TypedFieldValueTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::destroy(void *value)

{
  if (value != (void *)0x0) {
    if (*value != (long *)((long)value + 0x10)) {
      operator_delete(*value,*(long *)((long)value + 0x10) + 1);
    }
  }
  operator_delete(value,0x20);
  return;
}

Assistant:

static void destroy (void* value) { delete (Value*)value; }